

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O0

int Aig_ManSeqCleanupBasic(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *p_00;
  void *Entry;
  Aig_Obj_t *pAVar4;
  int local_34;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  pAVar3 = Aig_ManConst1(p);
  Aig_ObjSetTravIdCurrent(p,pAVar3);
  local_34 = 0;
  while( true ) {
    iVar1 = Aig_ManCiNum(p);
    iVar2 = Aig_ManRegNum(p);
    if (iVar1 - iVar2 <= local_34) break;
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,local_34);
    Aig_ObjSetTravIdCurrent(p,pAVar3);
    local_34 = local_34 + 1;
  }
  p_00 = Vec_PtrAlloc(100);
  local_34 = 0;
  while( true ) {
    iVar1 = Aig_ManCoNum(p);
    iVar2 = Aig_ManRegNum(p);
    if (iVar1 - iVar2 <= local_34) break;
    Entry = Vec_PtrEntry(p->vCos,local_34);
    Vec_PtrPush(p_00,Entry);
    local_34 = local_34 + 1;
  }
  for (local_34 = 0; iVar1 = Aig_ManRegNum(p), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar3 = Aig_ManLi(p,local_34);
    pAVar4 = Aig_ManLo(p,local_34);
    (pAVar4->field_0).pNext = pAVar3;
  }
  for (local_34 = 0; iVar1 = Vec_PtrSize(p_00), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p_00,local_34);
    Aig_ManSeqCleanup_rec(p,pAVar3,p_00);
  }
  iVar1 = Vec_PtrSize(p_00);
  iVar2 = Aig_ManCoNum(p);
  if (iVar1 <= iVar2) {
    for (local_34 = 0; iVar1 = Aig_ManRegNum(p), local_34 < iVar1; local_34 = local_34 + 1) {
      Aig_ManLi(p,local_34);
      pAVar3 = Aig_ManLo(p,local_34);
      (pAVar3->field_0).pNext = (Aig_Obj_t *)0x0;
    }
    iVar1 = Vec_PtrSize(p_00);
    iVar2 = Aig_ManCoNum(p);
    if (iVar1 < iVar2) {
      for (local_34 = 0; iVar1 = Vec_PtrSize(p->vCos), local_34 < iVar1; local_34 = local_34 + 1) {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_34);
        iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar3);
        if (iVar1 == 0) {
          pAVar4 = Aig_ManConst0(p);
          Aig_ObjPatchFanin0(p,pAVar3,pAVar4);
        }
      }
    }
    Vec_PtrFree(p_00);
    iVar1 = Aig_ManCleanup(p);
    return iVar1;
  }
  __assert_fail("Vec_PtrSize(vNodes) <= Aig_ManCoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigScl.c"
                ,0x119,"int Aig_ManSeqCleanupBasic(Aig_Man_t *)");
}

Assistant:

int Aig_ManSeqCleanupBasic( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
//    assert( Aig_ManBufNum(p) == 0 );

    // mark the PIs
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );

    // prepare to collect nodes reachable from POs
    vNodes = Vec_PtrAlloc( 100 );
    Aig_ManForEachPoSeq( p, pObj, i )
        Vec_PtrPush( vNodes, pObj );

    // remember latch inputs in latch outputs
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = pObjLi;
    // mark the nodes reachable from these nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ManSeqCleanup_rec( p, pObj, vNodes );
    assert( Vec_PtrSize(vNodes) <= Aig_ManCoNum(p) );
    // clean latch output pointers
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = NULL;

    // if some latches are removed, update PIs/POs
    if ( Vec_PtrSize(vNodes) < Aig_ManCoNum(p) )
    {
        // add constant drivers to the dangling latches
        Aig_ManForEachCo( p, pObj, i )
            if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
                Aig_ObjPatchFanin0( p, pObj, Aig_ManConst0(p) );
    }
    Vec_PtrFree( vNodes );
    // remove dangling nodes
    return Aig_ManCleanup( p );
}